

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::Analyze
          (StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *this,
          ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  data_ptr_t pdVar1;
  idx_t row_idx;
  bool bVar2;
  size_type __n;
  int64_t *piVar3;
  bool bVar4;
  reference rVar5;
  hugeint_t value;
  hugeint_t value_00;
  
  if (parent == (ColumnWriterState *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0
            || (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p !=
               (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
  }
  __n = (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1;
  if (bVar2) {
    count = ((long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1) - __n;
  }
  pdVar1 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 && !bVar2) {
    piVar3 = (int64_t *)(pdVar1 + 8);
    while (bVar2 = count != 0, count = count - 1, bVar2) {
      value_00.upper = *piVar3;
      value_00.lower = piVar3[-1];
      PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::Insert
                ((PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *)
                 &state_p[2].definition_levels,value_00);
      state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
      piVar3 = piVar3 + 2;
    }
  }
  else {
    row_idx = 0;
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      if (bVar2) {
        rVar5 = vector<bool,_true>::get<true>(&parent->is_empty,__n);
        if ((*rVar5._M_p & rVar5._M_mask) == 0) goto LAB_01e05bf5;
      }
      else {
LAB_01e05bf5:
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (bVar4) {
          value.upper = *(int64_t *)(pdVar1 + row_idx * 0x10 + 8);
          value.lower = *(uint64_t *)(pdVar1 + row_idx * 0x10);
          PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::Insert
                    ((PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>
                      *)&state_p[2].definition_levels,value);
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        }
        row_idx = row_idx + 1;
      }
      __n = __n + 1;
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}